

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O1

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::run(GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
      *this,double maxDuration,bool resetPopulation)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  Logger *this_00;
  undefined7 in_register_00000031;
  double dVar4;
  
  if ((int)CONCAT71(in_register_00000031,resetPopulation) != 0) {
    reset(this);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Time",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fitness",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  lVar1 = std::chrono::_V2::system_clock::now();
  dVar4 = 0.0;
  if (this->_minFitness <
      (this->_population)._chromosomes.
      super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(this->_population)._fittestChromosomeIndex].
      _fitness) {
    do {
      lVar2 = std::chrono::_V2::system_clock::now();
      dVar4 = (double)(lVar2 - lVar1) / 1000000000.0;
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
      poVar3 = std::ostream::_M_insert<double>
                         ((double)(this->_population)._chromosomes.
                                  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(this->_population)._fittestChromosomeIndex]._fitness);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      step(this,(float)dVar4);
      if (maxDuration <= dVar4) {
        this_00 = getLogger();
        Logger::warning<char[21]>
                  (this_00,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/rafagaitan[P]crsga/include/crsGA/GeneticAlgorithm.hpp"
                   ,0xb4,(char (*) [21])"Max duration reached");
        break;
      }
    } while (this->_minFitness <
             (this->_population)._chromosomes.
             super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(this->_population)._fittestChromosomeIndex].
             _fitness);
  }
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
  poVar3 = std::ostream::_M_insert<double>
                     ((double)(this->_population)._chromosomes.
                              super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                              ._M_impl.super__Vector_impl_data._M_start
                              [(this->_population)._fittestChromosomeIndex]._fitness);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Best:",5);
  poVar3 = operator<<((ostream *)&std::cout,
                      (this->_population)._chromosomes.
                      super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      (this->_population)._fittestChromosomeIndex);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void run(double maxDuration, bool resetPopulation = false)
    {
        if (resetPopulation)
            reset();
        std::cout << "Time"
                  << "\t"
                  << "Fitness" << std::endl;
        std::chrono::high_resolution_clock::time_point t1 = std::chrono::high_resolution_clock::now();
        auto simulationTime = std::chrono::duration_cast<std::chrono::duration<double>>(t1 - t1).count();
        while (!isSolution(_population.getFittestChromosome()))
        {
            std::chrono::high_resolution_clock::time_point t2 = std::chrono::high_resolution_clock::now();
            simulationTime = std::chrono::duration_cast<std::chrono::duration<double>>(t2 - t1).count();
            std::cout << simulationTime << "\t" << _population.getFittestChromosome().getFitness() << std::endl;
            step(simulationTime);
            if (simulationTime >= maxDuration)
            {
                LOG_WARNING("Max duration reached");
                break;
            }
        }
        std::cout << simulationTime << "\t" << _population.getFittestChromosome().getFitness() << std::endl;
        std::cout << "Best:" << _population.getFittestChromosome() << std::endl;
    }